

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Vec_Ptr_t * Abs_ManTernarySimulate(Aig_Man_t *p,int nFramesMax,int fVerbose)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p_00;
  void *Entry;
  Aig_Obj_t *pAVar4;
  abctime aVar5;
  uint uVar6;
  uint nCap;
  char *__format;
  uint iFrame;
  int iVar7;
  double dVar8;
  
  aVar3 = Abc_Clock();
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                  ,0xd0,"Vec_Ptr_t *Abs_ManTernarySimulate(Aig_Man_t *, int, int)");
  }
  uVar6 = p->vObjs->nSize - p->nDeleted;
  iFrame = 0;
  nCap = (int)(800000000 / (long)(int)uVar6) + 1;
  if (nFramesMax <= (int)nCap) {
    nCap = nFramesMax;
  }
  p_00 = Vec_PtrAlloc(nCap);
  uVar1 = 0;
  if (0 < (int)nCap) {
    uVar1 = nCap;
  }
  do {
    if (iFrame == uVar1) {
      if (fVerbose != 0) {
        dVar8 = (double)(p->vObjs->nSize - p->nDeleted) * (double)(int)nCap * 0.25;
        __format = "Ternary sim proved all outputs in the first %d frames.  Used %5.2f MB.  ";
LAB_004766e8:
        printf(__format,dVar8 * 9.5367431640625e-07,(ulong)nCap);
        iVar7 = (int)__format;
        Abc_Print(iVar7,"%s =","Time");
        aVar5 = Abc_Clock();
        Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
      }
      return p_00;
    }
    Entry = calloc((long)(int)((((int)uVar6 >> 4) + 1) - (uint)((uVar6 & 0xf) == 0)),4);
    Vec_PtrPush(p_00,Entry);
    if (iFrame == 0) {
      for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,p->nTruePis + iVar7);
        Abs_ManSimInfoSet(p_00,pAVar4,0,1);
      }
    }
    Abs_ManSimInfoSet(p_00,p->pConst1,iFrame,2);
    for (iVar7 = 0; iVar7 < p->nTruePis; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar7);
      Abs_ManSimInfoSet(p_00,pAVar4,iFrame,3);
    }
    for (iVar7 = 0; iVar7 < p->nTruePos; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
      Abs_ManExtendOneEval_rec(p_00,p,pAVar4,iFrame);
    }
    iVar7 = 0;
    while (iVar7 < p->nTruePos) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar7);
      iVar2 = Abs_ManSimInfoGet(p_00,pAVar4,iFrame);
      iVar7 = iVar7 + 1;
      if (iVar2 != 1) {
        if (fVerbose == 0) {
          return p_00;
        }
        dVar8 = (double)(p->vObjs->nSize - p->nDeleted) * (double)(int)(iFrame + 1) * 0.25;
        __format = "Ternary sim found non-zero output in frame %d.  Used %5.2f MB.  ";
        nCap = iFrame;
        goto LAB_004766e8;
      }
    }
    iFrame = iFrame + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Abs_ManTernarySimulate( Aig_Man_t * p, int nFramesMax, int fVerbose )
{
    Vec_Ptr_t * vSimInfo;
    Aig_Obj_t * pObj;
    int i, f, nFramesLimit, nFrameWords;
    abctime clk = Abc_Clock();
    assert( Aig_ManRegNum(p) > 0 );
    // the maximum number of frames will be determined to use at most 200Mb of RAM
    nFramesLimit = 1 + (200000000 * 4)/Aig_ManObjNum(p);
    nFramesLimit = Abc_MinInt( nFramesLimit, nFramesMax );
    nFrameWords  = Abc_BitWordNum( 2 * Aig_ManObjNum(p) );
    // allocate simulation info
    vSimInfo = Vec_PtrAlloc( nFramesLimit );
    for ( f = 0; f < nFramesLimit; f++ )
    {
        Vec_PtrPush( vSimInfo, ABC_CALLOC(unsigned, nFrameWords) );
        if ( f == 0 ) 
        {
            Saig_ManForEachLo( p, pObj, i )
                Abs_ManSimInfoSet( vSimInfo, pObj, 0, ABS_ZER );
        }
        Abs_ManSimInfoSet( vSimInfo, Aig_ManConst1(p), f, ABS_ONE );
        Saig_ManForEachPi( p, pObj, i )
            Abs_ManSimInfoSet( vSimInfo, pObj, f, ABS_UND );
        Saig_ManForEachPo( p, pObj, i )
            Abs_ManExtendOneEval_rec( vSimInfo, p, pObj, f );
        // check if simulation has derived at least one fail or unknown
        Saig_ManForEachPo( p, pObj, i )
            if ( Abs_ManSimInfoGet(vSimInfo, pObj, f) != ABS_ZER )
            {
                if ( fVerbose )
                {
                    printf( "Ternary sim found non-zero output in frame %d.  Used %5.2f MB.  ", 
                        f, 0.25 * (f+1) * Aig_ManObjNum(p) / (1<<20) );
                    ABC_PRT( "Time", Abc_Clock() - clk );
                }
                return vSimInfo;
            }
    }
    if ( fVerbose )
    {
        printf( "Ternary sim proved all outputs in the first %d frames.  Used %5.2f MB.  ", 
            nFramesLimit, 0.25 * nFramesLimit * Aig_ManObjNum(p) / (1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    return vSimInfo;
}